

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

void Memory::
     DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>>
               (AllocatorType *allocator,WeakArenaReference<Js::IDiagObjectModelDisplay> *obj)

{
  LONG *pLVar1;
  ReferencedArenaAdapter *pRVar2;
  
  pRVar2 = obj->adapter;
  LOCK();
  pLVar1 = &(pRVar2->super_RefCounted).refCount;
  *pLVar1 = *pLVar1 + -1;
  UNLOCK();
  if (*pLVar1 == 0) {
    (*(pRVar2->super_RefCounted)._vptr_RefCounted[1])();
  }
  obj->adapter = (ReferencedArenaAdapter *)0x0;
  HeapAllocator::Free(allocator,obj,0x10);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}